

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O0

void * safe_calloc(size_t nmemb,size_t size,char *name)

{
  void *pvVar1;
  undefined8 in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  void *ret;
  
  pvVar1 = calloc(in_RDI,in_RSI);
  if (pvVar1 == (void *)0x0) {
    fprintf(_stderr,"ERR: cannot alloc %s\n",in_RDX);
    exit(-1);
  }
  return pvVar1;
}

Assistant:

static void* safe_calloc(size_t nmemb, size_t size, const char* name) {
	void* ret;
	ret = calloc(nmemb, size);
	if (ret == NULL) {
		fprintf(stderr, "ERR: cannot alloc %s\n", name);
		exit(-1);
	}
	return ret;
}